

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QGraphicsItem_*>::squeeze(QList<QGraphicsItem_*> *this)

{
  Data *pDVar1;
  long lVar2;
  QArrayData *pQVar3;
  QGraphicsItem **__dest;
  QArrayData *pQVar4;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->d).d;
  if (pDVar1 == (Data *)0x0) goto LAB_0060f915;
  lVar2 = (this->d).size;
  if (((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) &&
     ((pDVar1->super_QArrayData).alloc <= lVar2)) {
LAB_0060f907:
    pQVar4 = &((this->d).d)->super_QArrayData;
  }
  else {
    local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    __dest = (QGraphicsItem **)QArrayData::allocate(&local_38,8,0x10,lVar2,KeepSize);
    pQVar4 = local_38;
    pQVar3 = &((this->d).d)->super_QArrayData;
    lVar2 = (this->d).size;
    if (lVar2 != 0) {
      if ((pQVar3 == (QArrayData *)0x0) ||
         (1 < (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i)) {
        memcpy(__dest,(this->d).ptr,lVar2 * 8);
        goto LAB_0060f8be;
      }
      memcpy(__dest,(this->d).ptr,lVar2 * 8);
      (this->d).d = (Data *)pQVar4;
      (this->d).ptr = __dest;
      (this->d).size = lVar2;
LAB_0060f8ef:
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,8,0x10);
      }
      goto LAB_0060f907;
    }
LAB_0060f8be:
    (this->d).d = (Data *)pQVar4;
    (this->d).ptr = __dest;
    (this->d).size = lVar2;
    if (pQVar3 != (QArrayData *)0x0) goto LAB_0060f8ef;
  }
  if (pQVar4 != (QArrayData *)0x0) {
    *(byte *)&(pQVar4->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pQVar4->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
               super_QFlagsStorage<QArrayData::ArrayOption>.i & 0xfe;
  }
LAB_0060f915:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QList<T>::squeeze()
{
    if (!d.isMutable())
        return;
    if (d->needsDetach() || size() < capacity()) {
        // must allocate memory
        DataPointer detached(size());
        if (size()) {
            if (d.needsDetach())
                detached->copyAppend(d.data(), d.data() + d.size);
            else
                detached->moveAppend(d.data(), d.data() + d.size);
        }
        d.swap(detached);
    }
    // We're detached so this is fine
    d->clearFlag(Data::CapacityReserved);
}